

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O3

void gl_SetPlaneTextureRotation(GLSectorPlane *secplane,FMaterial *gltexture)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float x;
  float fVar4;
  float fVar5;
  float y;
  
  fVar1 = (secplane->Offs).X;
  fVar2 = (secplane->Offs).Y;
  x = (secplane->Scale).X;
  if ((((fVar1 != 0.0) || (fVar2 != 0.0)) || (x != 1.0)) ||
     (((x = 1.0, (secplane->Scale).Y != 1.0 || (secplane->Angle != 0.0)) ||
      ((gltexture->mRenderWidth != 0x40 || (gltexture->mRenderHeight != 0x40)))))) {
    fVar5 = 1.0 / (float)(int)gltexture->mRenderWidth;
    fVar4 = 1.0 / (float)(int)gltexture->mRenderHeight;
    y = (secplane->Scale).Y;
    if ((*(ushort *)&gltexture->tex->field_0x31 & 0x20) != 0) {
      y = -y;
    }
    fVar3 = secplane->Angle;
    VSMatrix::loadIdentity(&gl_RenderState.mTextureMatrix);
    VSMatrix::scale(&gl_RenderState.mTextureMatrix,x,y,1.0);
    VSMatrix::translate(&gl_RenderState.mTextureMatrix,fVar1 * fVar5,fVar2 * fVar4,0.0);
    VSMatrix::scale(&gl_RenderState.mTextureMatrix,fVar5 * 64.0,fVar4 * 64.0,1.0);
    VSMatrix::rotate(&gl_RenderState.mTextureMatrix,-fVar3,0.0,0.0,1.0);
    gl_RenderState.mTextureMatrixEnabled = true;
  }
  return;
}

Assistant:

bool isZero() const
	{
		return X == 0 && Y == 0;
	}